

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor_qa.cpp
# Opt level: O3

Id dxil_spv::build_ssbo_load_array
             (Builder *builder,Id value_type,Id ssbo_id,uint32_t member,Id offset)

{
  Vector<Id> *this;
  Block *pBVar1;
  Id IVar2;
  Instruction *instruction;
  Instruction *instruction_00;
  uint *puVar3;
  iterator iVar4;
  Instruction *raw_instruction;
  Id IVar5;
  Instruction *raw_instruction_1;
  Id local_4c;
  uint local_48;
  Id local_44;
  _Head_base<0UL,_spv::Instruction_*,_false> local_40;
  _Head_base<0UL,_spv::Instruction_*,_false> local_38;
  
  local_48 = offset;
  local_44 = value_type;
  IVar2 = spv::Builder::makePointer(builder,StorageClassStorageBuffer,value_type);
  IVar5 = builder->uniqueId + 1;
  builder->uniqueId = IVar5;
  instruction = (Instruction *)allocate_in_thread(0x38);
  instruction->_vptr_Instruction = (_func_int **)&PTR__Instruction_001f31e0;
  instruction->resultId = IVar5;
  instruction->typeId = IVar2;
  instruction->opCode = OpAccessChain;
  this = &instruction->operands;
  (instruction->operands).
  super__Vector_base<unsigned_int,_dxil_spv::ThreadLocalAllocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (instruction->operands).
  super__Vector_base<unsigned_int,_dxil_spv::ThreadLocalAllocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (instruction->operands).
  super__Vector_base<unsigned_int,_dxil_spv::ThreadLocalAllocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  instruction->block = (Block *)0x0;
  local_4c = ssbo_id;
  std::vector<unsigned_int,dxil_spv::ThreadLocalAllocator<unsigned_int>>::
  _M_realloc_insert<unsigned_int_const&>
            ((vector<unsigned_int,dxil_spv::ThreadLocalAllocator<unsigned_int>> *)this,(iterator)0x0
             ,&local_4c);
  IVar2 = spv::Builder::makeIntegerType(builder,0x20,false);
  local_4c = spv::Builder::makeIntConstant(builder,IVar2,member,false);
  iVar4._M_current =
       (instruction->operands).
       super__Vector_base<unsigned_int,_dxil_spv::ThreadLocalAllocator<unsigned_int>_>._M_impl.
       super__Vector_impl_data._M_finish;
  puVar3 = (instruction->operands).
           super__Vector_base<unsigned_int,_dxil_spv::ThreadLocalAllocator<unsigned_int>_>._M_impl.
           super__Vector_impl_data._M_end_of_storage;
  if (iVar4._M_current == puVar3) {
    std::vector<unsigned_int,dxil_spv::ThreadLocalAllocator<unsigned_int>>::
    _M_realloc_insert<unsigned_int_const&>
              ((vector<unsigned_int,dxil_spv::ThreadLocalAllocator<unsigned_int>> *)this,iVar4,
               &local_4c);
    iVar4._M_current =
         (instruction->operands).
         super__Vector_base<unsigned_int,_dxil_spv::ThreadLocalAllocator<unsigned_int>_>._M_impl.
         super__Vector_impl_data._M_finish;
    puVar3 = (instruction->operands).
             super__Vector_base<unsigned_int,_dxil_spv::ThreadLocalAllocator<unsigned_int>_>._M_impl
             .super__Vector_impl_data._M_end_of_storage;
  }
  else {
    *iVar4._M_current = local_4c;
    iVar4._M_current = iVar4._M_current + 1;
    (instruction->operands).
    super__Vector_base<unsigned_int,_dxil_spv::ThreadLocalAllocator<unsigned_int>_>._M_impl.
    super__Vector_impl_data._M_finish = iVar4._M_current;
  }
  local_4c = local_48;
  if (iVar4._M_current == puVar3) {
    std::vector<unsigned_int,dxil_spv::ThreadLocalAllocator<unsigned_int>>::
    _M_realloc_insert<unsigned_int_const&>
              ((vector<unsigned_int,dxil_spv::ThreadLocalAllocator<unsigned_int>> *)this,iVar4,
               &local_4c);
  }
  else {
    *iVar4._M_current = local_48;
    (instruction->operands).
    super__Vector_base<unsigned_int,_dxil_spv::ThreadLocalAllocator<unsigned_int>_>._M_impl.
    super__Vector_impl_data._M_finish = iVar4._M_current + 1;
  }
  IVar2 = builder->uniqueId + 1;
  builder->uniqueId = IVar2;
  instruction_00 = (Instruction *)allocate_in_thread(0x38);
  instruction_00->_vptr_Instruction = (_func_int **)&PTR__Instruction_001f31e0;
  instruction_00->resultId = IVar2;
  instruction_00->typeId = local_44;
  instruction_00->opCode = OpLoad;
  (instruction_00->operands).
  super__Vector_base<unsigned_int,_dxil_spv::ThreadLocalAllocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (instruction_00->operands).
  super__Vector_base<unsigned_int,_dxil_spv::ThreadLocalAllocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (instruction_00->operands).
  super__Vector_base<unsigned_int,_dxil_spv::ThreadLocalAllocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  instruction_00->block = (Block *)0x0;
  local_4c = instruction->resultId;
  std::vector<unsigned_int,dxil_spv::ThreadLocalAllocator<unsigned_int>>::
  _M_realloc_insert<unsigned_int_const&>
            ((vector<unsigned_int,dxil_spv::ThreadLocalAllocator<unsigned_int>> *)
             &instruction_00->operands,(iterator)0x0,&local_4c);
  IVar2 = instruction_00->resultId;
  pBVar1 = builder->buildPoint;
  local_40._M_head_impl = instruction;
  std::
  vector<std::unique_ptr<spv::Instruction,std::default_delete<spv::Instruction>>,dxil_spv::ThreadLocalAllocator<std::unique_ptr<spv::Instruction,std::default_delete<spv::Instruction>>>>
  ::emplace_back<std::unique_ptr<spv::Instruction,std::default_delete<spv::Instruction>>>
            ((vector<std::unique_ptr<spv::Instruction,std::default_delete<spv::Instruction>>,dxil_spv::ThreadLocalAllocator<std::unique_ptr<spv::Instruction,std::default_delete<spv::Instruction>>>>
              *)&pBVar1->instructions,
             (unique_ptr<spv::Instruction,_std::default_delete<spv::Instruction>_> *)&local_40);
  instruction->block = pBVar1;
  if (instruction->resultId != 0) {
    spv::Module::mapInstruction(pBVar1->parent->parent,instruction);
  }
  if (local_40._M_head_impl != (Instruction *)0x0) {
    (*(local_40._M_head_impl)->_vptr_Instruction[1])();
  }
  local_40._M_head_impl = (Instruction *)0x0;
  pBVar1 = builder->buildPoint;
  local_38._M_head_impl = instruction_00;
  std::
  vector<std::unique_ptr<spv::Instruction,std::default_delete<spv::Instruction>>,dxil_spv::ThreadLocalAllocator<std::unique_ptr<spv::Instruction,std::default_delete<spv::Instruction>>>>
  ::emplace_back<std::unique_ptr<spv::Instruction,std::default_delete<spv::Instruction>>>
            ((vector<std::unique_ptr<spv::Instruction,std::default_delete<spv::Instruction>>,dxil_spv::ThreadLocalAllocator<std::unique_ptr<spv::Instruction,std::default_delete<spv::Instruction>>>>
              *)&pBVar1->instructions,
             (unique_ptr<spv::Instruction,_std::default_delete<spv::Instruction>_> *)&local_38);
  instruction_00->block = pBVar1;
  if (instruction_00->resultId != 0) {
    spv::Module::mapInstruction(pBVar1->parent->parent,instruction_00);
  }
  if (local_38._M_head_impl != (Instruction *)0x0) {
    (*(local_38._M_head_impl)->_vptr_Instruction[1])();
  }
  return IVar2;
}

Assistant:

static spv::Id build_ssbo_load_array(spv::Builder &builder, spv::Id value_type, spv::Id ssbo_id, uint32_t member,
                                     spv::Id offset)
{
	spv::Id ptr_id = builder.makePointer(spv::StorageClassStorageBuffer, value_type);
	auto chain = std::make_unique<spv::Instruction>(builder.getUniqueId(), ptr_id, spv::OpAccessChain);
	chain->addIdOperand(ssbo_id);
	chain->addIdOperand(builder.makeUintConstant(member));
	chain->addIdOperand(offset);

	auto load = std::make_unique<spv::Instruction>(builder.getUniqueId(), value_type, spv::OpLoad);
	load->addIdOperand(chain->getResultId());
	spv::Id result_id = load->getResultId();

	builder.getBuildPoint()->addInstruction(std::move(chain));
	builder.getBuildPoint()->addInstruction(std::move(load));
	return result_id;
}